

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_regex_options_order(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *__needle;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined1 *__n;
  undefined1 *__s1;
  undefined1 *puVar13;
  void *__s2;
  undefined1 *puVar14;
  int *piVar15;
  double *pdVar16;
  long *plVar17;
  undefined8 extraout_RAX;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  char *unaff_RBX;
  int *piVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  char *unaff_R12;
  undefined **ppuVar25;
  char *pcVar26;
  long lVar27;
  undefined **ppuVar28;
  int *unaff_R15;
  int *piVar29;
  double dVar30;
  int extraout_XMM0_Db;
  char *flags;
  char *pattern;
  bson_t b;
  bson_error_t error;
  code **ppcVar31;
  undefined4 uStack_5bdc;
  undefined8 uStack_5bd8;
  undefined2 uStack_5bd0;
  int iStack_5bc8;
  int iStack_5bc4;
  char acStack_5bc0 [504];
  code *pcStack_59c8;
  undefined1 auStack_59b8 [512];
  char *pcStack_57b8;
  code *pcStack_57b0;
  int iStack_57a0;
  int iStack_579c;
  char acStack_5798 [504];
  long *plStack_55a0;
  double *pdStack_5598;
  char *pcStack_5590;
  code *pcStack_5588;
  long lStack_5510;
  long lStack_5508;
  undefined1 auStack_5500 [128];
  undefined1 auStack_5480 [232];
  undefined1 auStack_5398 [608];
  long *plStack_5138;
  code *pcStack_5130;
  undefined1 auStack_5128 [8];
  char acStack_5120 [16];
  char *pcStack_5110;
  code *pcStack_5108;
  uint uStack_5084;
  undefined8 uStack_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 uStack_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 uStack_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 uStack_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined1 auStack_4fb8 [648];
  int *piStack_4d30;
  double *pdStack_4d28;
  undefined **ppuStack_4d20;
  int *piStack_4d18;
  int *piStack_4d10;
  code *pcStack_4d08;
  undefined1 auStack_4d00 [240];
  undefined1 auStack_4c10 [648];
  code *apcStack_4988 [16];
  double dStack_4908;
  int aiStack_4900 [50];
  int iStack_4838;
  int iStack_4834;
  int aiStack_4830 [160];
  int *piStack_45b0;
  double *pdStack_45a8;
  undefined **ppuStack_45a0;
  int *piStack_4598;
  int *piStack_4590;
  code *apcStack_4588 [16];
  double dStack_4508;
  int aiStack_4500 [50];
  int iStack_4438;
  int iStack_4434;
  int aiStack_4430 [160];
  undefined8 uStack_41b0;
  undefined1 *puStack_41a8;
  char *pcStack_41a0;
  char *pcStack_4198;
  undefined **ppuStack_4190;
  code *pcStack_4188;
  int iStack_4180;
  int iStack_417c;
  char acStack_4178 [504];
  undefined1 auStack_3f80 [336];
  char *pcStack_3e30;
  undefined1 *puStack_3e28;
  undefined1 *puStack_3e20;
  void *pvStack_3e18;
  void *pvStack_3e10;
  code *pcStack_3e08;
  undefined1 auStack_3e00 [128];
  char acStack_3d80 [232];
  undefined1 auStack_3c98 [648];
  char *pcStack_3a10;
  code *pcStack_3a08;
  undefined1 auStack_3a00 [128];
  char acStack_3980 [224];
  int iStack_38a0;
  int iStack_389c;
  char acStack_3898 [640];
  char *pcStack_3618;
  void *pvStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [128];
  char acStack_3580 [232];
  undefined1 auStack_3498 [648];
  char *pcStack_3210;
  code *pcStack_3208;
  undefined1 auStack_3200 [232];
  int iStack_3118;
  int iStack_3114;
  char acStack_3110 [640];
  char *pcStack_2e90;
  code *apcStack_2e88 [16];
  uint uStack_2e04;
  undefined1 auStack_2e00 [4];
  uint uStack_2dfc;
  undefined1 auStack_2d38 [648];
  undefined1 *puStack_2ab0;
  undefined1 *puStack_2aa8;
  undefined1 *puStack_2aa0;
  void *pvStack_2a98;
  void *pvStack_2a90;
  code *apcStack_2a88 [2];
  void *pvStack_2a78;
  char *pcStack_2a70;
  void *pvStack_2a68;
  char *pcStack_2a60;
  void *pvStack_2a58;
  char *pcStack_2a50;
  undefined1 *puStack_2a48;
  char *pcStack_2a40;
  undefined1 *puStack_2a38;
  char *pcStack_2a30;
  undefined8 uStack_2a28;
  char *pcStack_2a20;
  undefined8 uStack_2a18;
  char *pcStack_2a10;
  undefined8 uStack_2a08;
  undefined1 auStack_2a00 [4];
  uint uStack_29fc;
  undefined1 auStack_2938 [592];
  undefined8 uStack_26e8;
  char *pcStack_26e0;
  char *pcStack_26d8;
  char *pcStack_26d0;
  char *pcStack_26c8;
  char *pcStack_26c0;
  char *pcStack_26b8;
  char *pcStack_26b0;
  char *pcStack_26a8;
  char *pcStack_26a0;
  char *pcStack_2698;
  char *pcStack_2690;
  code *apcStack_2688 [7];
  void *pvStack_2650;
  undefined8 uStack_2648;
  char *pcStack_2640;
  void *pvStack_2638;
  char *pcStack_2630;
  undefined8 uStack_2628;
  char *pcStack_2620;
  void *pvStack_2618;
  char *pcStack_2610;
  undefined8 uStack_2608;
  char acStack_2600 [4];
  uint uStack_25fc;
  undefined1 auStack_2538 [648];
  undefined **ppuStack_22b0;
  char *pcStack_22a8;
  long lStack_22a0;
  undefined1 *puStack_2298;
  undefined1 *puStack_2290;
  code *pcStack_2288;
  int iStack_2280;
  int iStack_227c;
  char acStack_2278 [504];
  undefined1 auStack_2080 [168];
  undefined8 uStack_1fd8;
  long lStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1fc0;
  char *pcStack_1fb8;
  char *pcStack_1fb0;
  char *pcStack_1fa8;
  char *pcStack_1fa0;
  char *pcStack_1f98;
  long lStack_1f90;
  undefined8 uStack_1f88;
  char *pcStack_1f80;
  char *pcStack_1f78;
  char *pcStack_1f70;
  char *pcStack_1f68;
  long lStack_1f60;
  char *pcStack_1f58;
  char *pcStack_1f50;
  char *pcStack_1f48;
  char *pcStack_1f40;
  char *pcStack_1f38;
  char *pcStack_1f30;
  char *pcStack_1f28;
  char *pcStack_1f20;
  char *pcStack_1f18;
  char *pcStack_1f10;
  code *apcStack_1f08 [12];
  char *pcStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 uStack_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 uStack_1e40;
  undefined8 uStack_1e38;
  char *apcStack_1e30 [22];
  char acStack_1d80 [4];
  uint uStack_1d7c;
  undefined1 auStack_1cb8 [648];
  char *pcStack_1a30;
  undefined **ppuStack_1a28;
  int **ppiStack_1a20;
  char *pcStack_1a18;
  int *piStack_1a10;
  code *pcStack_1a08;
  undefined1 auStack_1a00 [128];
  undefined1 auStack_1980 [240];
  undefined1 auStack_1890 [648];
  code *pcStack_1608;
  undefined1 auStack_1600 [128];
  char acStack_1580 [232];
  int iStack_1498;
  int iStack_1494;
  char acStack_1490 [632];
  char *pcStack_1218;
  code *apcStack_1210 [2];
  int iStack_1200;
  int iStack_11fc;
  undefined8 uStack_1028;
  char *pcStack_1020;
  undefined8 uStack_1018;
  int *piStack_1010;
  code *pcStack_1008;
  int iStack_f84;
  int aiStack_f80 [46];
  undefined8 uStack_ec8;
  int *piStack_ec0;
  char acStack_eb4 [12];
  undefined1 auStack_ea8 [648];
  char *pcStack_c20;
  char *pcStack_c18;
  int *piStack_c10;
  code *apcStack_c08 [15];
  int iStack_b90;
  int iStack_b8c;
  int *piStack_b88;
  char acStack_b80 [200];
  undefined1 auStack_ab8 [648];
  char *pcStack_830;
  char *pcStack_828;
  code *apcStack_808 [14];
  int iStack_794;
  char *pcStack_790;
  int iStack_784;
  char acStack_780 [208];
  int iStack_6b0;
  int iStack_6ac;
  char acStack_6a8 [640];
  char *pcStack_428;
  code *pcStack_408;
  undefined8 local_400;
  char *local_390;
  undefined1 local_388 [8];
  undefined1 local_380 [224];
  undefined1 local_2a0 [648];
  
  pcStack_408 = (code *)0x130183;
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                              0xffffffffffffffff,local_2a0);
  if (cVar1 == '\0') {
    pcStack_408 = (code *)0x130296;
    test_bson_json_read_regex_options_order_cold_1();
LAB_00130296:
    pcStack_408 = (code *)0x1302a3;
    test_bson_json_read_regex_options_order_cold_3();
LAB_001302a3:
    pcStack_408 = (code *)0x1302ab;
    test_bson_json_read_regex_options_order_cold_2();
  }
  else {
    pcStack_408 = (code *)0x130190;
    unaff_RBX = (char *)bson_bcone_magic();
    local_400 = 0;
    pcStack_408 = (code *)0x1301c6;
    bcon_extract(local_380,"a",unaff_RBX,10,local_388,&local_390);
    if (local_390 != "ims") {
      pcStack_408 = (code *)0x1301e4;
      iVar2 = strcmp(local_390,"ims");
      if (iVar2 == 0) goto LAB_001301ec;
      goto LAB_001302a3;
    }
LAB_001301ec:
    pcStack_408 = (code *)0x1301fc;
    bson_destroy(local_380);
    pcStack_408 = (code *)0x13021a;
    cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                0xffffffffffffffff,local_2a0);
    if (cVar1 == '\0') goto LAB_00130296;
    local_400 = 0;
    pcStack_408 = (code *)0x130251;
    bcon_extract(local_380,"a",unaff_RBX,10,local_388,&local_390);
    if (local_390 == "ilms") {
LAB_00130273:
      pcStack_408 = (code *)0x130280;
      bson_destroy(local_380);
      return;
    }
    pcStack_408 = (code *)0x13026f;
    iVar2 = strcmp(local_390,"ilms");
    unaff_RBX = local_390;
    if (iVar2 == 0) goto LAB_00130273;
  }
  pcStack_408 = test_bson_json_read_binary;
  test_bson_json_read_regex_options_order_cold_4();
  apcStack_808[0] = (code *)0x1302ec;
  pcStack_428 = unaff_RBX;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(acStack_780,
                              "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
                              0xffffffffffffffff,&iStack_6b0);
  if (cVar1 == '\0') {
LAB_001304f8:
    apcStack_808[0] = (code *)0x130505;
    test_bson_json_read_binary_cold_1();
LAB_00130505:
    apcStack_808[0] = (code *)0x13050a;
    test_bson_json_read_binary_cold_2();
LAB_0013050a:
    apcStack_808[0] = (code *)0x13050f;
    test_bson_json_read_binary_cold_3();
LAB_0013050f:
    apcStack_808[0] = (code *)0x13051c;
    test_bson_json_read_binary_cold_5();
LAB_0013051c:
    apcStack_808[0] = (code *)0x130521;
    test_bson_json_read_binary_cold_6();
LAB_00130521:
    apcStack_808[0] = (code *)0x130526;
    test_bson_json_read_binary_cold_7();
LAB_00130526:
    apcStack_808[0] = (code *)0x13052b;
    test_bson_json_read_binary_cold_9();
LAB_0013052b:
    apcStack_808[0] = (code *)0x130530;
    test_bson_json_read_binary_cold_10();
LAB_00130530:
    apcStack_808[0] = (code *)0x130538;
    test_bson_json_read_binary_cold_15();
LAB_00130538:
    apcStack_808[0] = (code *)0x13053d;
    test_bson_json_read_binary_cold_11();
LAB_0013053d:
    apcStack_808[0] = (code *)0x130542;
    test_bson_json_read_binary_cold_12();
LAB_00130542:
    apcStack_808[0] = (code *)0x13054a;
    test_bson_json_read_binary_cold_13();
LAB_0013054a:
    apcStack_808[0] = (code *)0x130552;
    test_bson_json_read_binary_cold_4();
  }
  else {
    apcStack_808[0] = (code *)0x1302f9;
    unaff_RBX = (char *)bson_bcone_magic();
    unaff_R15 = &iStack_794;
    apcStack_808[0] = (code *)0x0;
    bcon_extract(acStack_780,"b",unaff_RBX,4,&iStack_784,&pcStack_790);
    if (iStack_784 != 5) goto LAB_00130505;
    if (iStack_794 != 3) goto LAB_0013050a;
    unaff_R12 = "foo";
    if (pcStack_790 != "foo") {
      apcStack_808[0] = (code *)0x13036d;
      iVar2 = strcmp(pcStack_790,"foo");
      if (iVar2 == 0) goto LAB_00130375;
      goto LAB_0013054a;
    }
LAB_00130375:
    apcStack_808[0] = (code *)0x130385;
    bson_destroy(acStack_780);
    apcStack_808[0] = (code *)0x1303a3;
    cVar1 = bson_init_from_json(acStack_780,
                                "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                ,0xffffffffffffffff,&iStack_6b0);
    if (cVar1 == '\0') goto LAB_0013050f;
    apcStack_808[0] = (code *)0x0;
    bcon_extract(acStack_780,"b",unaff_RBX,4,&iStack_784,&pcStack_790);
    if (iStack_784 != 5) goto LAB_0013051c;
    if (iStack_794 != 3) goto LAB_00130521;
    if (pcStack_790 == "foo") {
LAB_00130418:
      unaff_RBX = acStack_780;
      apcStack_808[0] = (code *)0x130428;
      bson_destroy(unaff_RBX);
      apcStack_808[0] = (code *)0x130446;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                  0xffffffffffffffff,&iStack_6b0);
      if (cVar1 != '\0') {
        apcStack_808[0] = (code *)0x1304f3;
        test_bson_json_read_binary_cold_16();
LAB_001304f3:
        apcStack_808[0] = (code *)0x1304f8;
        test_bson_json_read_binary_cold_14();
        goto LAB_001304f8;
      }
      if (iStack_6b0 != 1) goto LAB_00130526;
      if (iStack_6ac != 2) goto LAB_0013052b;
      unaff_RBX = acStack_6a8;
      apcStack_808[0] = (code *)0x130485;
      pcVar5 = strstr(unaff_RBX,"Missing \"base64\" after \"subType\"");
      if (pcVar5 == (char *)0x0) goto LAB_00130530;
      apcStack_808[0] = (code *)0x1304b1;
      cVar1 = bson_init_from_json(acStack_780,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                  0xffffffffffffffff,&iStack_6b0);
      if (cVar1 != '\0') goto LAB_001304f3;
      if (iStack_6b0 != 1) goto LAB_00130538;
      if (iStack_6ac != 2) goto LAB_0013053d;
      apcStack_808[0] = (code *)0x1304dc;
      pcVar5 = strstr(unaff_RBX,"Missing \"subType\" after \"base64\"");
      if (pcVar5 != (char *)0x0) {
        return;
      }
      goto LAB_00130542;
    }
    apcStack_808[0] = (code *)0x130410;
    iVar2 = strcmp(pcStack_790,"foo");
    unaff_RBX = pcStack_790;
    if (iVar2 == 0) goto LAB_00130418;
  }
  apcStack_808[0] = test_bson_json_read_legacy_binary;
  test_bson_json_read_binary_cold_8();
  pcVar22 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar25 = &PTR_anon_var_dwarf_1a81d_00161258;
  pcVar5 = "foo";
  pcStack_830 = unaff_RBX;
  pcStack_828 = unaff_R12;
  apcStack_808[0] = (code *)&pcStack_408;
  while( true ) {
    apcStack_c08[0] = (code *)0x1305ab;
    cVar1 = bson_init_from_json(acStack_b80,pcVar22,0xffffffffffffffff,auStack_ab8);
    if (cVar1 == '\0') break;
    apcStack_c08[0] = (code *)0x1305b8;
    uVar6 = bson_bcone_magic();
    apcStack_c08[0] = (code *)0x0;
    piStack_c10 = &iStack_b90;
    pcStack_c18 = (char *)0x1305e2;
    bcon_extract(acStack_b80,"x",uVar6,4,&iStack_b8c,&piStack_b88);
    if (iStack_b8c != 5) {
LAB_0013063e:
      apcStack_c08[0] = (code *)0x130643;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (iStack_b90 != 3) {
      apcStack_c08[0] = (code *)0x13063e;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_0013063e;
    }
    unaff_R15 = piStack_b88;
    if (piStack_b88 != (int *)"foo") {
      apcStack_c08[0] = (code *)0x13060d;
      iVar2 = strcmp((char *)piStack_b88,"foo");
      if (iVar2 == 0) goto LAB_00130611;
      goto LAB_00130650;
    }
LAB_00130611:
    apcStack_c08[0] = (code *)0x130619;
    bson_destroy(acStack_b80);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
  apcStack_c08[0] = (code *)0x130650;
  test_bson_json_read_legacy_binary_cold_1();
LAB_00130650:
  apcStack_c08[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_c18 = "foo";
  aiStack_f80[0x1c] = 0;
  aiStack_f80[0x1d] = 0;
  aiStack_f80[0x1e] = 0;
  aiStack_f80[0x1f] = 0;
  aiStack_f80[0x18] = 0;
  aiStack_f80[0x19] = 0;
  aiStack_f80[0x1a] = 0;
  aiStack_f80[0x1b] = 0;
  aiStack_f80[0x14] = 0;
  aiStack_f80[0x15] = 0;
  aiStack_f80[0x16] = 0;
  aiStack_f80[0x17] = 0;
  aiStack_f80[0x10] = 0;
  aiStack_f80[0x11] = 0;
  aiStack_f80[0x12] = 0;
  aiStack_f80[0x13] = 0;
  aiStack_f80[0xc] = 0;
  aiStack_f80[0xd] = 0;
  aiStack_f80[0xe] = 0;
  aiStack_f80[0xf] = 0;
  aiStack_f80[8] = 0;
  aiStack_f80[9] = 0;
  aiStack_f80[10] = 0;
  aiStack_f80[0xb] = 0;
  aiStack_f80[4] = 0;
  aiStack_f80[5] = 0;
  aiStack_f80[6] = 0;
  aiStack_f80[7] = 0;
  aiStack_f80[0] = 3;
  aiStack_f80[1] = 5;
  aiStack_f80[2] = 5;
  aiStack_f80[3] = 0;
  pcStack_1008 = (code *)0x1306dd;
  pcStack_c20 = acStack_b80;
  piStack_c10 = unaff_R15;
  apcStack_c08[0] = (code *)apcStack_808;
  pcVar22 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_ea8);
  if (pcVar22 == (char *)0x0) {
    pcStack_1008 = (code *)0x130826;
    test_json_reader_new_from_file_cold_6();
    pcVar22 = acStack_b80;
LAB_00130826:
    pcStack_1008 = (code *)0x13082b;
    test_json_reader_new_from_file_cold_5();
LAB_0013082b:
    pcStack_1008 = (code *)0x130843;
    test_json_reader_new_from_file_cold_1();
LAB_00130843:
    pcStack_1008 = (code *)0x130848;
    test_json_reader_new_from_file_cold_3();
LAB_00130848:
    pcStack_1008 = (code *)0x130860;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_1008 = (code *)0x130701;
    iVar2 = bson_json_reader_read(pcVar22,aiStack_f80,auStack_ea8);
    if (iVar2 != 1) goto LAB_0013082b;
    pcStack_1008 = (code *)0x13070f;
    pcVar5 = (char *)bson_bcone_magic();
    piStack_1010 = &iStack_f84;
    pcStack_1008 = (code *)0x0;
    uStack_1018 = 0xf;
    uStack_1028 = 0x13074c;
    pcStack_1020 = pcVar5;
    bcon_extract(aiStack_f80,"foo",pcVar5,0,&piStack_ec0,"a");
    unaff_R15 = piStack_ec0;
    if (piStack_ec0 == (int *)0x1408f8) {
LAB_00130776:
      if (iStack_f84 != 1) goto LAB_00130843;
      unaff_R15 = aiStack_f80;
      pcStack_1008 = (code *)0x130793;
      bson_reinit(unaff_R15);
      pcStack_1008 = (code *)0x1307a6;
      iVar2 = bson_json_reader_read(pcVar22,unaff_R15,auStack_ea8);
      if (iVar2 == 1) {
        unaff_R15 = (int *)&uStack_ec8;
        pcStack_1008 = (code *)0x1307db;
        bcon_extract(aiStack_f80,"_id",pcVar5,6,unaff_R15,0);
        pcVar5 = acStack_eb4;
        pcStack_1008 = (code *)0x1307f2;
        bson_oid_init_from_string(pcVar5,"aabbccddeeff001122334455");
        pcStack_1008 = (code *)0x1307fd;
        cVar1 = bson_oid_equal(pcVar5,uStack_ec8);
        if (cVar1 != '\0') {
          pcStack_1008 = (code *)0x13080e;
          bson_destroy(aiStack_f80);
          pcStack_1008 = (code *)0x130816;
          bson_json_reader_destroy(pcVar22);
          return;
        }
        goto LAB_00130826;
      }
      goto LAB_00130848;
    }
    pcStack_1008 = (code *)0x13076e;
    iVar2 = strcmp("bar",(char *)piStack_ec0);
    if (iVar2 == 0) goto LAB_00130776;
  }
  pcStack_1008 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_1210[0] = (code *)0x130880;
  lVar7 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_1200);
  if (lVar7 == 0) {
    if (iStack_1200 != 2) goto LAB_001308a4;
    if (iStack_11fc == 1) {
      return;
    }
  }
  else {
    apcStack_1210[0] = (code *)0x1308a4;
    test_json_reader_new_from_bad_path_cold_1();
LAB_001308a4:
    apcStack_1210[0] = (code *)0x1308a9;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_1210[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_1608 = (code *)0x1308e1;
  pcStack_1218 = pcVar22;
  apcStack_1210[0] = (code *)apcStack_c08;
  cVar1 = bson_init_from_json(acStack_1580,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_1498);
  if (cVar1 == '\0') {
LAB_00130c76:
    pcStack_1608 = (code *)0x130c83;
    test_bson_json_number_long_cold_1();
LAB_00130c83:
    pcStack_1608 = (code *)0x130c90;
    test_bson_json_number_long_cold_6();
LAB_00130c90:
    pcStack_1608 = (code *)0x130c98;
    test_bson_json_number_long_cold_9();
LAB_00130c98:
    pcStack_1608 = (code *)0x130ca5;
    test_bson_json_number_long_cold_10();
LAB_00130ca5:
    pcStack_1608 = (code *)0x130cad;
    test_bson_json_number_long_cold_13();
LAB_00130cad:
    pcStack_1608 = (code *)0x130cb2;
    test_bson_json_number_long_cold_14();
LAB_00130cb2:
    pcStack_1608 = (code *)0x130cb7;
    test_bson_json_number_long_cold_15();
LAB_00130cb7:
    pcStack_1608 = (code *)0x130cbf;
    test_bson_json_number_long_cold_28();
LAB_00130cbf:
    pcStack_1608 = (code *)0x130cc4;
    test_bson_json_number_long_cold_16();
LAB_00130cc4:
    pcStack_1608 = (code *)0x130cc9;
    test_bson_json_number_long_cold_17();
LAB_00130cc9:
    pcStack_1608 = (code *)0x130cd1;
    test_bson_json_number_long_cold_26();
LAB_00130cd1:
    pcStack_1608 = (code *)0x130cd6;
    test_bson_json_number_long_cold_18();
LAB_00130cd6:
    pcStack_1608 = (code *)0x130cdb;
    test_bson_json_number_long_cold_19();
LAB_00130cdb:
    pcStack_1608 = (code *)0x130ce3;
    test_bson_json_number_long_cold_24();
LAB_00130ce3:
    pcStack_1608 = (code *)0x130ce8;
    test_bson_json_number_long_cold_20();
LAB_00130ce8:
    pcStack_1608 = (code *)0x130ced;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_1608 = (code *)0x1308f9;
    cVar1 = bson_iter_init(auStack_1600,acStack_1580);
    if (cVar1 == '\0') {
      pcStack_1608 = (code *)0x130c35;
      test_bson_json_number_long_cold_2();
LAB_00130c35:
      pcStack_1608 = (code *)0x130c3a;
      test_bson_json_number_long_cold_3();
LAB_00130c3a:
      pcStack_1608 = (code *)0x130c3f;
      test_bson_json_number_long_cold_4();
LAB_00130c3f:
      pcStack_1608 = (code *)0x130c44;
      test_bson_json_number_long_cold_5();
LAB_00130c44:
      pcStack_1608 = (code *)0x130c49;
      test_bson_json_number_long_cold_31();
LAB_00130c49:
      pcStack_1608 = (code *)0x130c4e;
      test_bson_json_number_long_cold_30();
LAB_00130c4e:
      pcStack_1608 = (code *)0x130c53;
      test_bson_json_number_long_cold_7();
LAB_00130c53:
      pcStack_1608 = (code *)0x130c58;
      test_bson_json_number_long_cold_8();
LAB_00130c58:
      pcStack_1608 = (code *)0x130c5d;
      test_bson_json_number_long_cold_11();
LAB_00130c5d:
      pcStack_1608 = (code *)0x130c62;
      test_bson_json_number_long_cold_12();
LAB_00130c62:
      pcStack_1608 = (code *)0x130c67;
      test_bson_json_number_long_cold_29();
LAB_00130c67:
      pcStack_1608 = (code *)0x130c6c;
      test_bson_json_number_long_cold_27();
LAB_00130c6c:
      pcStack_1608 = (code *)0x130c71;
      test_bson_json_number_long_cold_25();
LAB_00130c71:
      pcStack_1608 = (code *)0x130c76;
      test_bson_json_number_long_cold_23();
      goto LAB_00130c76;
    }
    pcStack_1608 = (code *)0x130910;
    cVar1 = bson_iter_find(auStack_1600,"key");
    if (cVar1 == '\0') goto LAB_00130c35;
    pcStack_1608 = (code *)0x130920;
    iVar2 = bson_iter_type(auStack_1600);
    if (iVar2 != 0x12) goto LAB_00130c3a;
    pcStack_1608 = (code *)0x130931;
    lVar7 = bson_iter_int64(auStack_1600);
    if (lVar7 != 0x4000000000000000) goto LAB_00130c3f;
    pcVar22 = acStack_1580;
    pcStack_1608 = (code *)0x130954;
    bson_destroy(pcVar22);
    pcStack_1608 = (code *)0x130972;
    cVar1 = bson_init_from_json(pcVar22,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c44;
    pcStack_1608 = (code *)0x13099d;
    cVar1 = bson_init_from_json(acStack_1580,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c49;
    pcStack_1608 = (code *)0x1309c8;
    cVar1 = bson_init_from_json(acStack_1580,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 == '\0') goto LAB_00130c83;
    pcStack_1608 = (code *)0x1309e7;
    cVar1 = bson_iter_init_find(auStack_1600,acStack_1580,"x");
    if (cVar1 == '\0') goto LAB_00130c4e;
    pcStack_1608 = (code *)0x1309f7;
    iVar2 = bson_iter_type(auStack_1600);
    if (iVar2 != 0x12) goto LAB_00130c53;
    pcVar22 = (char *)0x7fffffffffffffff;
    pcStack_1608 = (code *)0x130a12;
    lVar7 = bson_iter_int64(auStack_1600);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00130c90;
    pcStack_1608 = (code *)0x130a3e;
    cVar1 = bson_init_from_json(acStack_1580,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 == '\0') goto LAB_00130c98;
    pcStack_1608 = (code *)0x130a5d;
    cVar1 = bson_iter_init_find(auStack_1600,acStack_1580,"x");
    if (cVar1 == '\0') goto LAB_00130c58;
    pcStack_1608 = (code *)0x130a6d;
    iVar2 = bson_iter_type(auStack_1600);
    if (iVar2 != 0x12) goto LAB_00130c5d;
    pcStack_1608 = (code *)0x130a7e;
    lVar7 = bson_iter_int64(auStack_1600);
    pcVar22 = (char *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_00130ca5;
    pcVar22 = acStack_1580;
    pcStack_1608 = (code *)0x130a9a;
    bson_destroy(pcVar22);
    pcStack_1608 = (code *)0x130ab8;
    cVar1 = bson_init_from_json(pcVar22,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c62;
    if (iStack_1498 != 1) goto LAB_00130cad;
    if (iStack_1494 != 2) goto LAB_00130cb2;
    pcVar22 = acStack_1490;
    pcStack_1608 = (code *)0x130af7;
    pcVar8 = strstr(pcVar22,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cb7;
    pcStack_1608 = (code *)0x130b23;
    cVar1 = bson_init_from_json(acStack_1580,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c67;
    if (iStack_1498 != 1) goto LAB_00130cbf;
    if (iStack_1494 != 2) goto LAB_00130cc4;
    pcStack_1608 = (code *)0x130b5a;
    pcVar8 = strstr(pcVar22,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cc9;
    pcStack_1608 = (code *)0x130b86;
    cVar1 = bson_init_from_json(acStack_1580,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c6c;
    if (iStack_1498 != 1) goto LAB_00130cd1;
    if (iStack_1494 != 2) goto LAB_00130cd6;
    pcStack_1608 = (code *)0x130bbd;
    pcVar8 = strstr(pcVar22,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00130cdb;
    pcStack_1608 = (code *)0x130be9;
    cVar1 = bson_init_from_json(acStack_1580,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_1498);
    if (cVar1 != '\0') goto LAB_00130c71;
    if (iStack_1498 != 1) goto LAB_00130ce3;
    if (iStack_1494 != 2) goto LAB_00130ce8;
    pcStack_1608 = (code *)0x130c20;
    pcVar8 = strstr(pcVar22,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_1608 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1a08 = (code *)0x130d27;
  pcStack_1608 = (code *)apcStack_1210;
  cVar1 = bson_init_from_json(auStack_1980,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1890);
  if (cVar1 != '\0') {
    pcStack_1a08 = (code *)0x130d3b;
    cVar1 = bson_iter_init(auStack_1a00,auStack_1980);
    if (cVar1 == '\0') {
      pcStack_1a08 = (code *)0x130d83;
      test_bson_json_number_long_zero_cold_2();
LAB_00130d83:
      pcStack_1a08 = (code *)0x130d88;
      test_bson_json_number_long_zero_cold_3();
LAB_00130d88:
      pcStack_1a08 = (code *)0x130d8d;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1a08 = (code *)0x130d4e;
      cVar1 = bson_iter_find(auStack_1a00,"key");
      if (cVar1 == '\0') goto LAB_00130d83;
      pcStack_1a08 = (code *)0x130d5a;
      iVar2 = bson_iter_type(auStack_1a00);
      if (iVar2 != 0x12) goto LAB_00130d88;
      pcStack_1a08 = (code *)0x130d67;
      lVar7 = bson_iter_int64(auStack_1a00);
      if (lVar7 == 0) {
        pcStack_1a08 = (code *)0x130d79;
        bson_destroy(auStack_1980);
        return;
      }
    }
    pcStack_1a08 = (code *)0x130d92;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1a08 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_1f08[0] = (code *)0x130dbc;
  pcStack_1a30 = pcVar22;
  ppuStack_1a28 = ppuVar25;
  ppiStack_1a20 = &piStack_b88;
  pcStack_1a18 = pcVar5;
  piStack_1a10 = unaff_R15;
  pcStack_1a08 = (code *)&pcStack_1608;
  lVar7 = bson_bcon_magic();
  apcStack_1f08[0] = (code *)0x130de7;
  pcStack_1ea8 = (char *)bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_1f08[0] = (code *)0x130e0a;
  uStack_1e38 = bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_1f08[0] = (code *)0x130e33;
  uVar6 = bcon_new(0,"var",lVar7,0xf,1,0);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x130e59;
  uStack_1e40 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  apcStack_1f08[0] = (code *)0x130e86;
  uVar9 = bcon_new(0,"var2",lVar7,0x11,2,0);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x130eac;
  uStack_1e48 = bcon_new(0,"a",lVar7,0xe,"b",uVar9);
  apcStack_1f08[0] = (code *)0x0;
  pcStack_1f18 = "d";
  pcStack_1f20 = (char *)0xe;
  pcStack_1f30 = "c";
  pcStack_1f38 = (char *)0x130ef6;
  pcStack_1f28 = (char *)lVar7;
  pcStack_1f10 = (char *)uVar9;
  uStack_1e80 = uVar9;
  uStack_1e50 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = "}";
  pcStack_1f20 = "}";
  pcStack_1f28 = "value2";
  pcStack_1f30 = (char *)0x0;
  pcStack_1f40 = "key2";
  pcStack_1f48 = "{";
  pcStack_1f50 = "subdoc";
  pcStack_1f58 = "value";
  lStack_1f60 = 0;
  pcStack_1f70 = "key1";
  pcStack_1f78 = "{";
  pcStack_1f80 = "c";
  uStack_1f88 = 0x130f7a;
  pcStack_1f68 = (char *)lVar7;
  pcStack_1f38 = (char *)lVar7;
  uStack_1e58 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x130fbe;
  uStack_1e78 = uVar6;
  uStack_1e60 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  apcStack_1f08[0] = (code *)0x130fe7;
  uStack_1e88 = bcon_new(0,"var","{","}",0);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x13100f;
  uStack_1e68 = bcon_new(0,"a",lVar7,0xe,"b",uStack_1e88);
  apcStack_1f08[0] = (code *)0x0;
  pcStack_1f10 = "}";
  pcStack_1f18 = "}";
  pcStack_1f20 = (char *)0x3;
  pcStack_1f28 = (char *)0xf;
  pcStack_1f38 = "z";
  pcStack_1f40 = "{";
  pcStack_1f48 = "d3";
  pcStack_1f50 = (char *)0x1;
  pcStack_1f58 = (char *)0xf;
  pcStack_1f68 = "x";
  pcStack_1f70 = "{";
  pcStack_1f78 = "d2";
  pcStack_1f80 = (char *)0x1;
  uStack_1f88 = 0x11;
  pcStack_1f98 = "n";
  pcStack_1fa0 = "}";
  pcStack_1fa8 = "{";
  pcStack_1fb0 = "d";
  pcStack_1fb8 = "]";
  uStack_1fc0 = 2;
  uStack_1fc8 = 0xf;
  uStack_1fd8 = 0x1310bd;
  lStack_1fd0 = lVar7;
  lStack_1f90 = lVar7;
  lStack_1f60 = lVar7;
  pcStack_1f30 = (char *)lVar7;
  uStack_1e90 = bcon_new(0,"arr","[",lVar7,0xf,1);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x1310f6;
  uStack_1e70 = bcon_new(0,"a",lVar7,0xe,"b",uStack_1e90);
  apcStack_1f08[0] = (code *)0x131107;
  uStack_1e98 = bson_new();
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x13112f;
  pcVar22 = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_1e98);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = "}";
  pcStack_1f20 = "c";
  pcStack_1f28 = (char *)0x131172;
  uStack_1ea0 = bcon_new(0,"x","{","$code",lVar7,0);
  pcStack_1f10 = (char *)0x0;
  pcStack_1f18 = (char *)0x131197;
  apcStack_1e30[0x15] = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_1ea0);
  apcStack_1e30[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_1e30[1] = pcStack_1ea8;
  apcStack_1e30[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_1e30[3] = (char *)uStack_1e38;
  apcStack_1e30[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_1e30[5] = (char *)uStack_1e40;
  apcStack_1e30[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_1e30[7] = (char *)uStack_1e48;
  apcStack_1e30[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_1e30[9] = (char *)uStack_1e58;
  apcStack_1e30[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_1e30[0xb] = (char *)uStack_1e50;
  apcStack_1e30[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_1e30[0xd] = (char *)uStack_1e60;
  apcStack_1e30[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_1e30[0xf] = (char *)uStack_1e68;
  apcStack_1e30[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_1e30[0x11] = (char *)uStack_1e70;
  apcStack_1e30[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_1e30[0x13] = pcVar22;
  apcStack_1e30[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar26 = (char *)0x8;
  pcVar5 = acStack_1d80;
  pcVar8 = "b";
  while( true ) {
    apcStack_1f08[0] = (code *)0x13130a;
    cVar1 = bson_init_from_json(pcVar5,*(undefined8 *)((long)&uStack_1e38 + (long)pcVar26),
                                0xffffffffffffffff,auStack_1cb8);
    __needle = pcVar26;
    if (cVar1 == '\0') break;
    apcStack_1f08[0] = (code *)0x13131d;
    pcStack_1ea8 = (char *)bson_get_data(pcVar5);
    lVar7 = *(long *)((long)apcStack_1e30 + (long)pcVar26);
    apcStack_1f08[0] = (code *)0x131332;
    __needle = (char *)bson_get_data(lVar7);
    if (*(uint *)(lVar7 + 4) != uStack_1d7c) {
LAB_001313fc:
      apcStack_1f08[0] = (code *)0x13140e;
      pcVar5 = (char *)bson_as_canonical_extended_json(acStack_1d80);
      apcStack_1f08[0] = (code *)0x13141b;
      uVar6 = bson_as_canonical_extended_json(lVar7);
      pcVar22 = pcStack_1ea8;
      uVar20 = 0xffffffff;
      if (uStack_1d7c == 0) goto LAB_00131463;
      uVar23 = 0;
      goto LAB_00131448;
    }
    apcStack_1f08[0] = (code *)0x13134e;
    pvVar10 = (void *)bson_get_data(lVar7);
    apcStack_1f08[0] = (code *)0x131359;
    pvVar11 = (void *)bson_get_data(pcVar5);
    apcStack_1f08[0] = (code *)0x131368;
    iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(lVar7 + 4));
    if (iVar2 != 0) goto LAB_001313fc;
    apcStack_1f08[0] = (code *)0x13137b;
    bson_destroy(pcVar5);
    pcVar26 = pcVar26 + 0x10;
    pcVar8 = pcVar5;
    pcVar22 = __needle;
    if (pcVar26 == (char *)0xb8) {
      lVar7 = 8;
      do {
        apcStack_1f08[0] = (code *)0x13139e;
        bson_destroy(*(undefined8 *)((long)apcStack_1e30 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0xb8);
      apcStack_1f08[0] = (code *)0x1313b8;
      bson_destroy(uStack_1e78);
      apcStack_1f08[0] = (code *)0x1313c5;
      bson_destroy(uStack_1e80);
      apcStack_1f08[0] = (code *)0x1313cf;
      bson_destroy(uStack_1e88);
      apcStack_1f08[0] = (code *)0x1313d9;
      bson_destroy(uStack_1e90);
      apcStack_1f08[0] = (code *)0x1313e3;
      bson_destroy(uStack_1ea0);
      apcStack_1f08[0] = (code *)0x1313ed;
      bson_destroy(uStack_1e98);
      return;
    }
  }
  goto LAB_00131529;
  while( true ) {
    if (pcStack_1ea8[uVar23] != __needle[uVar23]) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_1d7c == (uint)uVar23) break;
LAB_00131448:
    if (*(int *)(lVar7 + 4) == (int)uVar23) break;
  }
LAB_00131463:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_1d7c;
    if (uStack_1d7c < *(uint *)(lVar7 + 4)) {
      uVar3 = *(uint *)(lVar7 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_1f08[0] = (code *)0x131494;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar5,uVar6);
  apcStack_1f08[0] = (code *)0x1314ac;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar8 = (char *)(ulong)uVar3;
  apcStack_1f08[0] = (code *)0x1314c6;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pcStack_1ea8 = (char *)CONCAT44(pcStack_1ea8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131515:
    apcStack_1f08[0] = (code *)0x13151a;
    test_bson_json_code_cold_6();
LAB_0013151a:
    apcStack_1f08[0] = (code *)0x13151f;
    test_bson_json_code_cold_5();
LAB_0013151f:
    apcStack_1f08[0] = (code *)0x131524;
    test_bson_json_code_cold_2();
  }
  else {
    pcVar5 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013151a;
    pcVar8 = (char *)(ulong)uStack_1d7c;
    apcStack_1f08[0] = (code *)0x1314ed;
    pcVar26 = (char *)write(uVar3,pcVar22,(size_t)pcVar8);
    if (pcVar26 != pcVar8) goto LAB_0013151f;
    pcVar8 = (char *)(ulong)*(uint *)(lVar7 + 4);
    apcStack_1f08[0] = (code *)0x131504;
    pcVar26 = (char *)write(uVar4,__needle,(size_t)pcVar8);
    if (pcVar26 == pcVar8) {
      apcStack_1f08[0] = (code *)0x131515;
      test_bson_json_code_cold_4();
      goto LAB_00131515;
    }
  }
  apcStack_1f08[0] = (code *)0x131529;
  test_bson_json_code_cold_3();
LAB_00131529:
  apcStack_1f08[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar27 = 8;
  pcStack_1f30 = pcVar8;
  pcStack_1f28 = __needle;
  pcStack_1f20 = pcVar22;
  pcStack_1f18 = pcVar5;
  pcStack_1f10 = (char *)lVar7;
  apcStack_1f08[0] = (code *)&pcStack_1a08;
  do {
    pcStack_2288 = (code *)0x13157d;
    cVar1 = bson_init_from_json(auStack_2080,*(undefined8 *)(&UNK_00161268 + lVar27),
                                0xffffffffffffffff,&iStack_2280);
    if (cVar1 != '\0') {
      pcStack_2288 = (code *)0x1315ca;
      test_bson_json_code_errors_cold_3();
LAB_001315ca:
      pcStack_2288 = (code *)0x1315cf;
      test_bson_json_code_errors_cold_2();
LAB_001315cf:
      pcStack_2288 = (code *)0x1315ef;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_2278,
              __needle);
      pcStack_2288 = (code *)0x1315f4;
      abort();
    }
    if (iStack_2280 != 1) {
      pcStack_2288 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_22b0 = &PTR_anon_var_dwarf_1ab4d_00161270;
      apcStack_2688[0] = (code *)0x131616;
      pcStack_22a8 = __needle;
      lStack_22a0 = lVar27;
      puStack_2298 = auStack_2080;
      puStack_2290 = (undefined1 *)&iStack_2280;
      pcStack_2288 = (code *)apcStack_1f08;
      uVar6 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2688[0] = (code *)0x131635;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar11 = (void *)0x0;
      pcVar22 = "$ref";
      pcStack_2690 = (char *)0x0;
      pcStack_2698 = "}";
      pcStack_26a0 = oid_zero_oid;
      pcStack_26a8 = (char *)0x6;
      pcStack_26b8 = "$id";
      pcStack_26c0 = "collection";
      pcStack_26c8 = (char *)0x131696;
      pcStack_26b0 = (char *)uVar6;
      pvStack_2650 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2690 = (char *)0x0;
      pcStack_2698 = "}";
      pcStack_26a0 = (char *)0x1;
      pcStack_26a8 = (char *)0xf;
      pcStack_26b8 = "$id";
      pcStack_26c0 = "collection";
      pcStack_26c8 = (char *)0x1316e6;
      pcStack_26b0 = (char *)uVar6;
      uStack_2648 = bcon_new(0,"key","{","$ref",uVar6,0);
      apcStack_2688[0] = (code *)0x0;
      pcStack_2690 = "}";
      pcStack_2698 = "}";
      pcStack_26a0 = (char *)0x1;
      pcStack_26a8 = (char *)0xf;
      pcStack_26b8 = "a";
      pcStack_26c0 = "{";
      pcStack_26c8 = "$id";
      pcStack_26d0 = "collection";
      pcStack_26d8 = (char *)0x13173e;
      pcStack_26b0 = (char *)uVar6;
      pvVar10 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2690 = (char *)0x0;
      pcStack_2698 = "}";
      pcStack_26a0 = (char *)0x1;
      pcStack_26a8 = (char *)0x7;
      pcStack_26b8 = "meta";
      pcStack_26c0 = (char *)0x1;
      pcStack_26c8 = (char *)0xf;
      pcStack_26d8 = "$id";
      pcStack_26e0 = "collection";
      uStack_26e8 = 0x1317a1;
      pcStack_26d0 = (char *)uVar6;
      pcStack_26b0 = (char *)uVar6;
      uStack_2608 = bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2640 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2638 = pvStack_2650;
      pcStack_2630 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2628 = uStack_2648;
      pcStack_2620 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2618 = pvVar10;
      pcStack_2610 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar5 = "key";
      break;
    }
    if (iStack_227c != 2) goto LAB_001315ca;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1ab4d_00161270 + lVar27);
    pcStack_2288 = (code *)0x1315a4;
    pcVar5 = strstr(acStack_2278,__needle);
    if (pcVar5 == (char *)0x0) goto LAB_001315cf;
    lVar27 = lVar27 + 0x10;
    if (lVar27 == 0x98) {
      return;
    }
  } while( true );
LAB_001317fb:
  apcStack_2688[0] = (code *)0x131817;
  cVar1 = bson_init_from_json(acStack_2600,*(undefined8 *)((long)&pcStack_2640 + (long)pvVar11),
                              0xffffffffffffffff,auStack_2538);
  pcVar8 = acStack_2600;
  pvVar12 = pvVar11;
  if (cVar1 == '\0') goto LAB_001319dd;
  apcStack_2688[0] = (code *)0x13182a;
  pvStack_2650 = (void *)bson_get_data(acStack_2600);
  pcVar8 = *(char **)((long)&pvStack_2638 + (long)pvVar11);
  apcStack_2688[0] = (code *)0x13183c;
  pvVar12 = (void *)bson_get_data(pcVar8);
  if (*(uint *)(pcVar8 + 4) != uStack_25fc) {
LAB_001318b1:
    apcStack_2688[0] = (code *)0x1318c3;
    pcVar22 = (char *)bson_as_canonical_extended_json(acStack_2600);
    apcStack_2688[0] = (code *)0x1318d0;
    uVar6 = bson_as_canonical_extended_json(pcVar8);
    pvVar10 = pvStack_2650;
    uVar20 = 0xffffffff;
    if (uStack_25fc == 0) goto LAB_00131915;
    uVar23 = 0;
    goto LAB_001318fb;
  }
  apcStack_2688[0] = (code *)0x131853;
  pcVar22 = (char *)bson_get_data(pcVar8);
  apcStack_2688[0] = (code *)0x13185e;
  pvVar10 = (void *)bson_get_data(acStack_2600);
  apcStack_2688[0] = (code *)0x13186c;
  iVar2 = bcmp(pcVar22,pvVar10,(ulong)*(uint *)(pcVar8 + 4));
  if (iVar2 != 0) goto LAB_001318b1;
  apcStack_2688[0] = (code *)0x13187b;
  bson_destroy(acStack_2600);
  pvVar11 = (void *)((long)pvVar11 + 0x10);
  pcVar5 = acStack_2600;
  pvVar10 = pvVar12;
  if (pvVar11 == (void *)0x40) {
    lVar7 = 8;
    do {
      apcStack_2688[0] = (code *)0x131898;
      bson_destroy(*(undefined8 *)((long)&pcStack_2640 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x48);
    return;
  }
  goto LAB_001317fb;
  while( true ) {
    if (*(char *)((long)pvStack_2650 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_25fc == (uint)uVar23) break;
LAB_001318fb:
    if (*(int *)(pcVar8 + 4) == (int)uVar23) break;
  }
LAB_00131915:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_25fc;
    if (uStack_25fc < *(uint *)(pcVar8 + 4)) {
      uVar3 = *(uint *)(pcVar8 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_2688[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar22,uVar6);
  apcStack_2688[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar5 = (char *)(ulong)uVar3;
  apcStack_2688[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2650 = (void *)CONCAT44(pvStack_2650._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_2688[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_2688[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_2688[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar22 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar5 = (char *)(ulong)uStack_25fc;
    apcStack_2688[0] = (code *)0x1319a2;
    pcVar26 = (char *)write(uVar3,pvVar10,(size_t)pcVar5);
    if (pcVar26 != pcVar5) goto LAB_001319d3;
    pcVar8 = (char *)(ulong)*(uint *)(pcVar8 + 4);
    apcStack_2688[0] = (code *)0x1319b8;
    pcVar26 = (char *)write(uVar4,pvVar12,(size_t)pcVar8);
    if (pcVar26 == pcVar8) {
      apcStack_2688[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_2688[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_2688[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_2a88[0] = (code *)0x131a07;
  pcStack_26b0 = pcVar8;
  pcStack_26a8 = pcVar5;
  pcStack_26a0 = pcVar22;
  pcStack_2698 = (char *)pvVar12;
  pcStack_2690 = (char *)pvVar10;
  apcStack_2688[0] = (code *)&pcStack_2288;
  uVar6 = bson_bcon_magic();
  apcStack_2a88[0] = (code *)0x131a29;
  pvStack_2a78 = (void *)bcon_new(0,"euro",uVar6,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_2a88[0] = (code *)0x131a4d;
  pvVar10 = (void *)bcon_new(0,"crlf",uVar6,0,"\r\n",0);
  apcStack_2a88[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar6,0,"\"",0);
  apcStack_2a88[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar6,0,"\\",0);
  apcStack_2a88[0] = (code *)0x131aaf;
  uVar9 = bcon_new(0,"",uVar6,0,"",0);
  apcStack_2a88[0] = (code *)0x131ad1;
  uVar6 = bcon_new(0,"escapes",uVar6,0,"\f\b\t",0);
  apcStack_2a88[0] = (code *)0x131ad9;
  uStack_2a08 = bson_new();
  pcStack_2a70 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2a68 = pvStack_2a78;
  pcStack_2a60 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2a50 = "{ \"quote\": \"\\\"\"}";
  pcStack_2a40 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2a30 = "{ \"\": \"\"}";
  pcStack_2a20 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2a10 = "{ \"nil\": \"\\u0000\"}";
  apcStack_2a88[0] = (code *)0x131b76;
  pvStack_2a58 = pvVar10;
  puStack_2a48 = __n;
  puStack_2a38 = __s1;
  uStack_2a28 = uVar9;
  uStack_2a18 = uVar6;
  bson_append_utf8(uStack_2a08,"nil",0xffffffff,"",1);
  pvVar11 = (void *)0x8;
  while( true ) {
    apcStack_2a88[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_2a00,*(undefined8 *)((long)&pvStack_2a78 + (long)pvVar11),
                                0xffffffffffffffff,auStack_2938);
    puVar14 = auStack_2a00;
    pvVar12 = pvVar11;
    if (cVar1 == '\0') break;
    apcStack_2a88[0] = (code *)0x131bb3;
    pvStack_2a78 = (void *)bson_get_data(auStack_2a00);
    puVar14 = *(undefined1 **)((long)&pcStack_2a70 + (long)pvVar11);
    apcStack_2a88[0] = (code *)0x131bc5;
    pvVar12 = (void *)bson_get_data(puVar14);
    if (*(uint *)(puVar14 + 4) != uStack_29fc) {
LAB_00131c3a:
      apcStack_2a88[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_2a00);
      apcStack_2a88[0] = (code *)0x131c59;
      uVar6 = bson_as_canonical_extended_json(puVar14);
      pvVar10 = pvStack_2a78;
      uVar20 = 0xffffffff;
      if (uStack_29fc == 0) goto LAB_00131c9e;
      uVar23 = 0;
      goto LAB_00131c84;
    }
    apcStack_2a88[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar14);
    apcStack_2a88[0] = (code *)0x131be7;
    pvVar10 = (void *)bson_get_data(auStack_2a00);
    apcStack_2a88[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar10,(ulong)*(uint *)(puVar14 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_2a88[0] = (code *)0x131c04;
    bson_destroy(auStack_2a00);
    pvVar11 = (void *)((long)pvVar11 + 0x10);
    __n = auStack_2a00;
    pvVar10 = pvVar12;
    if (pvVar11 == (void *)0x78) {
      lVar7 = 8;
      do {
        apcStack_2a88[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_2a70 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)pvStack_2a78 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
      uVar20 = uVar23 & 0xffffffff;
      break;
    }
    uVar23 = uVar23 + 1;
    if (uStack_29fc == (uint)uVar23) break;
LAB_00131c84:
    if (*(int *)(puVar14 + 4) == (int)uVar23) break;
  }
LAB_00131c9e:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_29fc;
    if (uStack_29fc < *(uint *)(puVar14 + 4)) {
      uVar3 = *(uint *)(puVar14 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_2a88[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__s1,uVar6);
  apcStack_2a88[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_2a88[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2a78 = (void *)CONCAT44(pvStack_2a78._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_2a88[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_2a88[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_2a88[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_29fc;
    apcStack_2a88[0] = (code *)0x131d2b;
    puVar13 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar13 != __n) goto LAB_00131d5c;
    puVar14 = (undefined1 *)(ulong)*(uint *)(puVar14 + 4);
    apcStack_2a88[0] = (code *)0x131d41;
    puVar13 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar14);
    if (puVar13 == puVar14) {
      apcStack_2a88[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_2a88[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_2a88[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_2e88[0] = (code *)0x131d90;
  puStack_2ab0 = puVar14;
  puStack_2aa8 = __n;
  puStack_2aa0 = __s1;
  pvStack_2a98 = pvVar12;
  pvStack_2a90 = pvVar10;
  apcStack_2a88[0] = (code *)apcStack_2688;
  uVar6 = bson_bcon_magic();
  apcStack_2e88[0] = (code *)0x131daf;
  pcVar5 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar6,0,"euro",0);
  apcStack_2e88[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_2e00,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_2d38);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_2e88[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_2e88[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_2e88[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_2e88[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_2e88[0] = (code *)0x131ded;
    pvVar10 = (void *)bson_get_data(auStack_2e00);
    apcStack_2e88[0] = (code *)0x131df8;
    pvVar12 = (void *)bson_get_data(pcVar5);
    if (*(uint *)(pcVar5 + 4) == uStack_2dfc) {
      apcStack_2e88[0] = (code *)0x131e0d;
      pvVar11 = (void *)bson_get_data(pcVar5);
      apcStack_2e88[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_2e00);
      apcStack_2e88[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar11,__s2,(ulong)*(uint *)(pcVar5 + 4));
      if (iVar2 == 0) {
        apcStack_2e88[0] = (code *)0x131e3c;
        bson_destroy(auStack_2e00);
        apcStack_2e88[0] = (code *)0x131e44;
        bson_destroy(pcVar5);
        return;
      }
    }
    __s1 = auStack_2e00;
    apcStack_2e88[0] = (code *)0x131e65;
    uVar6 = bson_as_canonical_extended_json(__s1);
    apcStack_2e88[0] = (code *)0x131e72;
    uVar9 = bson_as_canonical_extended_json(pcVar5);
    uVar20 = 0xffffffff;
    if (uStack_2dfc != 0) {
      uVar23 = 0;
      do {
        if (*(int *)(pcVar5 + 4) == (int)uVar23) break;
        if (*(char *)((long)pvVar10 + uVar23) != *(char *)((long)pvVar12 + uVar23)) {
          uVar20 = uVar23 & 0xffffffff;
          break;
        }
        uVar23 = uVar23 + 1;
      } while (uStack_2dfc != (uint)uVar23);
    }
    if ((int)uVar20 == -1) {
      uVar3 = uStack_2dfc;
      if (uStack_2dfc < *(uint *)(pcVar5 + 4)) {
        uVar3 = *(uint *)(pcVar5 + 4);
      }
      uVar20 = (ulong)(uVar3 - 1);
    }
    apcStack_2e88[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar6,uVar9);
    apcStack_2e88[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_2e88[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2e04 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_2dfc;
    apcStack_2e88[0] = (code *)0x131f2a;
    puVar14 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar14 != __n) goto LAB_00131f60;
    pcVar5 = (char *)(ulong)*(uint *)(pcVar5 + 4);
    apcStack_2e88[0] = (code *)0x131f40;
    pcVar22 = (char *)write(uVar4,pvVar12,(size_t)pcVar5);
    if (pcVar22 == pcVar5) {
      apcStack_2e88[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_2e88[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_3208 = (code *)0x131f98;
  pcStack_2e90 = pcVar5;
  apcStack_2e88[0] = (code *)apcStack_2a88;
  cVar1 = bson_init_from_json(auStack_3200,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_3118);
  if (cVar1 == '\0') {
    if (iStack_3118 != 1) goto LAB_00131fe4;
    if (iStack_3114 != 1) goto LAB_00131fe9;
    pcVar5 = acStack_3110;
    pcStack_3208 = (code *)0x131fcb;
    pcVar22 = strstr(pcVar5,"UESCAPE_TOOSHORT");
    if (pcVar22 != (char *)0x0) {
      pcStack_3208 = (code *)0x131fd8;
      bson_destroy(auStack_3200);
      return;
    }
  }
  else {
    pcStack_3208 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_3208 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_3208 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_3208 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3608 = (code *)0x132029;
  pcStack_3210 = pcVar5;
  pcStack_3208 = (code *)apcStack_2e88;
  cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3498);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_3608 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_3608 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_3608 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3608 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') {
      pcStack_3608 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_3608 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_3608 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_3608 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_3608 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_3608 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_3608 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_3608 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_3608 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_3608 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_3600);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar5 = acStack_3580;
    pcStack_3608 = (code *)0x132084;
    bson_destroy(pcVar5);
    pcStack_3608 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_3608 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_3608 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_3608 = (code *)0x1320e2;
    bson_iter_int32(auStack_3600);
  }
  pcStack_3608 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_3608 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_3608 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_3608 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_3608 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3a08 = (code *)0x1322a4;
  pcStack_3618 = pcVar5;
  pvStack_3610 = pvVar12;
  pcStack_3608 = (code *)&pcStack_3208;
  cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_38a0);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_3a08 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_3a08 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_3a08 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_3a08 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_3a08 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_3a08 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_3a08 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_3a08 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_3a08 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_3a08 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_3a08 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_3a08 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_3a08 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_3a08 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_3a08 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3a08 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') {
      pcStack_3a08 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_3a08 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_3a08 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_3a08 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_3a08 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_3a08 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_3a08 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_3a08 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_3a08 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_3a08 = (code *)0x1322ee;
    lVar7 = bson_iter_int64(auStack_3a00);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x132307;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_38a0);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_3a08 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_3a08 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_3a08 = (code *)0x132365;
    lVar7 = bson_iter_int64(auStack_3a00);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_0013255f;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x132381;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_38a0);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_38a0 != 1) goto LAB_00132567;
    if (iStack_389c != 2) goto LAB_0013256c;
    pcVar5 = acStack_3898;
    pcStack_3a08 = (code *)0x1323de;
    pcVar22 = strstr(pcVar5,"Number \"9223372036854775808\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132571;
    pcStack_3a08 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_38a0);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_38a0 != 1) goto LAB_00132579;
    if (iStack_389c != 2) goto LAB_0013257e;
    pcStack_3a08 = (code *)0x132441;
    pcVar22 = strstr(pcVar5,"Number \"-9223372036854775809\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132583;
    pcStack_3a08 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_38a0);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_38a0 != 1) goto LAB_0013258b;
    if (iStack_389c != 2) goto LAB_00132590;
    pcStack_3a08 = (code *)0x1324a4;
    pcVar22 = strstr(pcVar5,"Number \"10000000000000000000\" is out of range");
    if (pcVar22 == (char *)0x0) goto LAB_00132595;
    pcStack_3a08 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_38a0);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_38a0 != 1) goto LAB_0013259d;
    if (iStack_389c != 2) goto LAB_001325a2;
    pcStack_3a08 = (code *)0x132503;
    pcVar22 = strstr(pcVar5,"Number \"-10000000000000000000\" is out of range");
    if (pcVar22 != (char *)0x0) {
      return;
    }
  }
  pcStack_3a08 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_3e08 = (code *)0x1325e2;
  pcStack_3a10 = pcVar5;
  pcStack_3a08 = (code *)&pcStack_3608;
  cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": 1 }",0xffffffffffffffff,auStack_3c98);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_3e08 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_3e08 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_3e08 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_3e08 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_3e08 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_3e08 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_3e08 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_3e08 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_3e08 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_3e08 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') {
      pcStack_3e08 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_3e08 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_3e08 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_3e08 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_3e08 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_3e08 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_3e08 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_3e08 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_3e08 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_3e08 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_3e08 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_3e08 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_3e08 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_3e00);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar5 = acStack_3d80;
    pcStack_3e08 = (code *)0x13263b;
    bson_destroy(pcVar5);
    pcStack_3e08 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_3c98);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_3e08 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_3e08 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_3e08 = (code *)0x132699;
    lVar7 = bson_iter_int64(auStack_3e00);
    if (lVar7 != 0x100000000) goto LAB_001328a9;
    pcVar5 = acStack_3d80;
    pcStack_3e08 = (code *)0x1326bc;
    bson_destroy(pcVar5);
    pcStack_3e08 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_3c98);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_3e08 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_3e08 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_3e08 = (code *)0x13271a;
    dVar30 = (double)bson_iter_double(auStack_3e00);
    if ((dVar30 != 1.0) || (NAN(dVar30))) goto LAB_001328be;
    pcVar5 = acStack_3d80;
    pcStack_3e08 = (code *)0x13273e;
    bson_destroy(pcVar5);
    pcStack_3e08 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_3c98);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_3e08 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_3e08 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_3e08 = (code *)0x13279c;
    dVar30 = (double)bson_iter_double(auStack_3e00);
    if ((dVar30 != 0.0) || (NAN(dVar30))) goto LAB_001328d3;
    pcVar5 = acStack_3d80;
    pcStack_3e08 = (code *)0x1327c0;
    bson_destroy(pcVar5);
    pcStack_3e08 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_3c98);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_3e08 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_3e08 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_3e08 = (code *)0x132816;
    dVar30 = (double)bson_iter_double(auStack_3e00);
    if ((dVar30 == 0.0) && (!NAN(dVar30))) {
      pcStack_3e08 = (code *)0x132832;
      bson_iter_double(auStack_3e00);
      if (extraout_XMM0_Db < 0) {
        pcStack_3e08 = (code *)0x132849;
        bson_destroy(acStack_3d80);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_3e08 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar22 = "2e400";
  ppuVar25 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_3e30 = pcVar5;
  puStack_3e28 = __n;
  puStack_3e20 = __s1;
  pvStack_3e18 = pvVar12;
  pvStack_3e10 = pvVar10;
  pcStack_3e08 = (code *)&pcStack_3a08;
  while( true ) {
    pcStack_4188 = (code *)0x13292e;
    uVar6 = bson_strdup_printf("{ \"d\" : %s }",pcVar22);
    pcStack_4188 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_3f80,uVar6,0xffffffffffffffff,&iStack_4180);
    if (cVar1 != '\0') break;
    if (iStack_4180 != 1) goto LAB_00132a15;
    if (iStack_417c != 2) goto LAB_00132a10;
    pcStack_4188 = (code *)0x132979;
    pcVar5 = strstr(acStack_4178,"out of range");
    if (pcVar5 == (char *)0x0) goto LAB_00132a1a;
    pcStack_4188 = (code *)0x13298a;
    bson_free(uVar6);
    pcStack_4188 = (code *)0x13299b;
    uVar6 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar22);
    pcStack_4188 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_3f80,uVar6,0xffffffffffffffff,&iStack_4180);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_4180 != 1) goto LAB_00132a29;
    if (iStack_417c != 2) goto LAB_00132a24;
    pcStack_4188 = (code *)0x1329da;
    pcVar5 = strstr(acStack_4178,"out of range");
    if (pcVar5 == (char *)0x0) goto LAB_00132a2e;
    pcStack_4188 = (code *)0x1329e7;
    bson_free(uVar6);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
  pcStack_4188 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_4188 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_4188 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_4188 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_4188 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_4188 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_4188 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_4188 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_41a0 = "out of range";
  pcVar8 = "{ \"d\": NaN }";
  ppuVar28 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar21 = aiStack_4500;
  piVar15 = &iStack_4438;
  piVar29 = (int *)0x14a6f6;
  pcVar5 = (char *)&dStack_4508;
  uStack_41b0 = uVar6;
  puStack_41a8 = (undefined1 *)&iStack_4180;
  pcStack_4198 = pcVar22;
  ppuStack_4190 = ppuVar25;
  pcStack_4188 = (code *)&pcStack_3e08;
  do {
    apcStack_4588[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar21,pcVar8,0xffffffffffffffff,piVar15);
    if (cVar1 == '\0') {
      apcStack_4588[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_4588[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_4588[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_4588[0] = (code *)0x132a99;
    uVar6 = bson_bcone_magic();
    apcStack_4588[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar21,"d",uVar6,1,pcVar5,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_4508) && !NAN(dStack_4508)) goto LAB_00132bfa;
    apcStack_4588[0] = (code *)0x132ad4;
    bson_destroy(piVar21);
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar22 = "{ \"d\": NaNn }";
  ppuVar28 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar21 = aiStack_4430;
  piVar15 = aiStack_4500;
  piVar29 = &iStack_4438;
  pcVar5 = "Got parse error at";
  do {
    apcStack_4588[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_4438 != 1) goto LAB_00132c16;
    if (iStack_4434 != 1) goto LAB_00132c09;
    apcStack_4588[0] = (code *)0x132b53;
    pcVar22 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132c0e;
    pcVar22 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": nu";
  ppuVar28 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar21 = aiStack_4430;
  piVar15 = aiStack_4500;
  piVar29 = &iStack_4438;
  pcVar5 = "Incomplete JSON";
  while( true ) {
    apcStack_4588[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_4438 != 1) goto LAB_00132c28;
    if (iStack_4434 != 1) goto LAB_00132c1b;
    apcStack_4588[0] = (code *)0x132bcf;
    pcVar22 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132c20;
    pcVar22 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_4588[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_4588[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_4588[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_4588[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_4588[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_4588[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_4588[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar22 = "{ \"d\": Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_45b0 = piVar21;
  pdStack_45a8 = (double *)pcVar5;
  ppuStack_45a0 = ppuVar28;
  piStack_4598 = piVar15;
  piStack_4590 = piVar29;
  apcStack_4588[0] = (code *)&pcStack_4188;
  do {
    apcStack_4988[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_4900,pcVar22,0xffffffffffffffff,&iStack_4838);
    if (cVar1 == '\0') {
      apcStack_4988[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_4988[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_4988[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_4988[0] = (code *)0x132c8e;
    uVar6 = bson_bcone_magic();
    apcStack_4988[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_4900,"d",uVar6,1,&dStack_4908,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_4908)) || (!NAN(dStack_4908 - dStack_4908) && !NAN(dStack_4908 - dStack_4908)))
    goto LAB_00132eb6;
    apcStack_4988[0] = (code *)0x132cd7;
    bson_destroy(aiStack_4900);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar5 = "{ \"d\": -Infinity }";
  ppuVar25 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_4988[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_4900,pcVar5,0xffffffffffffffff,&iStack_4838);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_4988[0] = (code *)0x132d2d;
    uVar6 = bson_bcone_magic();
    apcStack_4988[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_4900,"d",uVar6,1,&dStack_4908,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_4908)) || (!NAN(dStack_4908 - dStack_4908))) goto LAB_00132ec5;
    if (0.0 <= dStack_4908) goto LAB_00132eca;
    apcStack_4988[0] = (code *)0x132d88;
    bson_destroy(aiStack_4900);
    pcVar5 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar5 != (char *)0x0);
  pcVar22 = "{ \"d\": Infinityy }";
  ppuVar25 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar21 = aiStack_4830;
  piVar15 = aiStack_4900;
  piVar29 = &iStack_4838;
  pcVar5 = "Got parse error at";
  do {
    apcStack_4988[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_4838 != 1) goto LAB_00132ee6;
    if (iStack_4834 != 1) goto LAB_00132ed9;
    apcStack_4988[0] = (code *)0x132e0b;
    pcVar22 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar22 == (char *)0x0) goto LAB_00132ede;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar22 = "{ \"d\": In";
  ppuVar25 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar21 = aiStack_4830;
  piVar15 = aiStack_4900;
  piVar29 = &iStack_4838;
  pcVar5 = "Incomplete JSON";
  while( true ) {
    apcStack_4988[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar15,pcVar22,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_4838 != 1) goto LAB_00132ef8;
    if (iStack_4834 != 1) goto LAB_00132eeb;
    apcStack_4988[0] = (code *)0x132e8b;
    pcVar22 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar22 == (char *)0x0) goto LAB_00132ef0;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_4988[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_4988[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_4988[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_4988[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_4988[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_4988[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_4988[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_4d08 = (code *)0x132f2a;
  apcStack_4988[0] = (code *)apcStack_4588;
  cVar1 = bson_init_from_json(auStack_4d00,"{ \"x\": null }",0xffffffffffffffff,auStack_4c10);
  if (cVar1 == '\0') {
    pcStack_4d08 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_4d08 = (code *)0x132f33;
    uVar6 = bson_bcone_magic();
    pcStack_4d08 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_4d00,"x",uVar6,9,0);
    if (cVar1 != '\0') {
      pcStack_4d08 = (code *)0x132f5b;
      bson_destroy(auStack_4d00);
      return;
    }
  }
  pcStack_4d08 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_5108 = (code *)0x0;
  pcStack_5110 = "}";
  acStack_5120[8] = -0x52;
  acStack_5120[9] = '/';
  acStack_5120[10] = '\x13';
  acStack_5120[0xb] = '\0';
  acStack_5120[0xc] = '\0';
  acStack_5120[0xd] = '\0';
  acStack_5120[0xe] = '\0';
  acStack_5120[0xf] = '\0';
  piStack_4d30 = piVar21;
  pdStack_4d28 = (double *)pcVar5;
  ppuStack_4d20 = ppuVar25;
  piStack_4d18 = piVar15;
  piStack_4d10 = piVar29;
  pcStack_4d08 = (code *)apcStack_4988;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_5010 = 0;
  uStack_5008 = 0;
  uStack_5020 = 0;
  uStack_5018 = 0;
  uStack_5030 = 0;
  uStack_5028 = 0;
  uStack_5040 = 0;
  uStack_5038 = 0;
  uStack_5050 = 0;
  uStack_5048 = 0;
  uStack_5060 = 0;
  uStack_5058 = 0;
  uStack_5070 = 0;
  uStack_5068 = 0;
  uStack_5080 = (undefined *)0x500000003;
  uStack_5078 = 5;
  pcStack_5108 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_5080,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_4fb8);
  if (cVar1 != '\0') {
    pcStack_5108 = (code *)0x133023;
    piVar29 = (int *)bson_get_data(&uStack_5080);
    pcStack_5108 = (code *)0x13302e;
    piVar15 = (int *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_5080._4_4_) {
      pcStack_5108 = (code *)0x133043;
      pvVar10 = (void *)bson_get_data(uVar20);
      pcStack_5108 = (code *)0x133053;
      pvVar11 = (void *)bson_get_data(&uStack_5080);
      pcStack_5108 = (code *)0x133061;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_5108 = (code *)0x133072;
        bson_destroy(&uStack_5080);
        pcStack_5108 = (code *)0x13307a;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar25 = (undefined **)&uStack_5080;
    pcStack_5108 = (code *)0x13309b;
    uVar6 = bson_as_canonical_extended_json(ppuVar25);
    pcStack_5108 = (code *)0x1330a8;
    uVar9 = bson_as_canonical_extended_json(uVar20);
    uVar23 = 0xffffffff;
    if (uStack_5080._4_4_ != 0) {
      uVar24 = 0;
      do {
        if (*(int *)(uVar20 + 4) == (int)uVar24) break;
        if (*(char *)((long)piVar29 + uVar24) != *(char *)((long)piVar15 + uVar24)) {
          uVar23 = uVar24 & 0xffffffff;
          break;
        }
        uVar24 = uVar24 + 1;
      } while (uStack_5080._4_4_ != (uint)uVar24);
    }
    if ((int)uVar23 == -1) {
      uVar3 = uStack_5080._4_4_;
      if (uStack_5080._4_4_ < *(uint *)(uVar20 + 4)) {
        uVar3 = *(uint *)(uVar20 + 4);
      }
      uVar23 = (ulong)(uVar3 - 1);
    }
    pcStack_5108 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar23,uVar6,uVar9);
    pcStack_5108 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar5 = (char *)(ulong)uVar3;
    pcStack_5108 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_5084 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_5108 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_5108 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_5108 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar25 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar5 = (char *)((ulong)uStack_5080 >> 0x20);
      pcStack_5108 = (code *)0x133160;
      pdVar16 = (double *)write(uVar3,piVar29,(size_t)pcVar5);
      if (pdVar16 != (double *)pcVar5) goto LAB_00133191;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_5108 = (code *)0x133176;
      uVar23 = write(uVar4,piVar15,uVar20);
      if (uVar23 == uVar20) {
        pcStack_5108 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_5108 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_5108 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar22 = acStack_5120;
  acStack_5120[8] = '\0';
  acStack_5120[9] = '\0';
  acStack_5120[10] = '\0';
  acStack_5120[0xb] = '\0';
  acStack_5120[0xc] = '\0';
  acStack_5120[0xd] = '\0';
  acStack_5120[0xe] = '@';
  acStack_5120[0xf] = '0';
  acStack_5120[0] = '\v';
  acStack_5120[1] = '\0';
  acStack_5120[2] = '\0';
  acStack_5120[3] = '\0';
  acStack_5120[4] = '\0';
  acStack_5120[5] = '\0';
  acStack_5120[6] = '\0';
  acStack_5120[7] = '\0';
  pcStack_5130 = (code *)0x1331ce;
  pcStack_5110 = (char *)uVar20;
  pcStack_5108 = (code *)piVar15;
  plVar17 = (long *)bson_new();
  pcStack_5130 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar17,"decimal128",0xffffffff,pcVar22);
  if (cVar1 == '\0') {
    pcStack_5130 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_5130 = (code *)0x1331f7;
    pcVar22 = (char *)bson_as_json(plVar17,auStack_5128);
    if (pcVar22 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_5130 = (code *)0x133221;
      bson_free(pcVar22);
      pcStack_5130 = (code *)0x133229;
      bson_destroy(plVar17);
      return;
    }
    pcStack_5130 = (code *)0x133215;
    iVar2 = strcmp(pcVar22,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_5130 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar31 = &pcStack_5130;
  pcStack_5588 = (code *)0x133271;
  plStack_5138 = plVar17;
  pcStack_5130 = (code *)&pcStack_4d08;
  cVar1 = bson_init_from_json(auStack_5480,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_5398);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_5588 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_5500,auStack_5480);
  if (cVar1 == '\0') {
    pcStack_5588 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_5588 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_5588 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_5588 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_5588 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_5500,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_5588 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_5500);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar17 = &lStack_5510;
    pcStack_5588 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_5500,plVar17);
    if (lStack_5510 != 0xb) goto LAB_0013330b;
    if (lStack_5508 == 0x3040000000000000) {
      pcStack_5588 = (code *)0x1332f5;
      bson_destroy(auStack_5480);
      return;
    }
  }
  pcStack_5588 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_5588 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar8 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar28 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_55a0 = plVar17;
  pdStack_5598 = (double *)pcVar5;
  pcStack_5590 = pcVar22;
  pcStack_5588 = (code *)piVar29;
  do {
    pcStack_57b0 = (code *)0x133357;
    lVar7 = bson_new_from_json(pcVar8,0xffffffffffffffff,&iStack_57a0);
    if (lVar7 != 0) {
      pcStack_57b0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_57b0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5798,
              piVar29);
      pcStack_57b0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_57a0 != 1) {
LAB_001333cc:
      pcStack_57b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_59c8 = (code *)0x1333f1;
      pcStack_57b8 = acStack_5798;
      pcStack_57b0 = (code *)&iStack_57a0;
      pcVar5 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_59b8);
      pcStack_59c8 = (code *)0x1333fe;
      pcVar22 = (char *)bson_as_json(pcVar5,0);
      if (pcVar22 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_59c8 = (code *)0x133428;
        bson_free(pcVar22);
        pcStack_59c8 = (code *)0x133430;
        bson_destroy(pcVar5);
        return;
      }
      pcStack_59c8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar22,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_59c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_5bd8 = 0x2200223a2261227b;
      uStack_5bd0 = 0x7d;
      uStack_5bdc = 0x227b;
      pcStack_59c8 = (code *)pcVar5;
      lVar7 = bson_new_from_json(&uStack_5bd8,9,&iStack_5bc8);
      if (lVar7 == 0) {
        if (iStack_5bc8 != 1) goto LAB_001334fc;
        if (iStack_5bc4 != 1) goto LAB_00133501;
        pcVar5 = acStack_5bc0;
        pcVar8 = strstr(pcVar5,"Got parse error");
        if (pcVar8 == (char *)0x0) goto LAB_00133506;
        lVar7 = bson_new_from_json(&uStack_5bdc,3,&iStack_5bc8);
        if (lVar7 != 0) goto LAB_001334f7;
        if (iStack_5bc8 != 1) goto LAB_0013350e;
        if (iStack_5bc4 == 1) {
          pcVar8 = strstr(pcVar5,"Got parse error");
          if (pcVar8 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar6 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0,uVar6,pcVar5,ppuVar28,ppuVar25,pcVar22,piVar29,ppcVar31);
      uVar18 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar6,uVar18,0);
      uVar6 = bson_new();
      uVar18 = bson_new();
      uVar19 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar6,uVar18,uVar19,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar6,0);
      uVar6 = bson_new();
      _test_json_produces_multiple("[]",0,uVar6,0);
      uVar6 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar6,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_579c != 2) {
      pcStack_57b0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar29 = (int *)ppuVar28[-1];
    pcStack_57b0 = (code *)0x13337e;
    pcVar5 = strstr(acStack_5798,(char *)piVar29);
    if (pcVar5 == (char *)0x0) goto LAB_001333a4;
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 2;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_4588[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_4988[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_4988[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_4988[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar15 = &iStack_4838;
  pcVar5 = (char *)&dStack_4908;
  piVar21 = aiStack_4900;
  piVar29 = (int *)0x14a6f6;
  apcStack_4988[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_4988[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_read_regex_options_order (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ims");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ilms");

   bson_destroy (&b);
}